

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_chk2cmp2_8_pcix(void)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  uVar2 = m68ki_read_imm_16();
  bVar1 = *(byte *)((long)m68ki_cpu.dar + (ulong)(uVar2 >> 10 & 0x3c));
  uVar3 = m68ki_get_ea_pcix();
  uVar4 = m68ki_read_8_fc(uVar3,m68ki_cpu.s_flag | 2);
  uVar3 = m68ki_read_8_fc(uVar3 + 1,m68ki_cpu.s_flag | 2);
  uVar5 = (uint)(char)bVar1;
  if ((short)uVar2 < 0) {
    uVar5 = (uint)bVar1;
  }
  m68ki_cpu.not_z_flag = (uint)(uVar4 != uVar5 && uVar3 != uVar5);
  m68ki_cpu.c_flag =
       (uint)(((int)uVar3 < (int)uVar5 || (int)uVar3 < (int)uVar4) || (int)uVar5 < (int)uVar4) << 8;
  if (((uVar2 >> 0xb & 1) != 0) &&
     (((int)uVar3 < (int)uVar5 || (int)uVar3 < (int)uVar4) || (int)uVar5 < (int)uVar4)) {
    m68ki_exception_trap(6);
    return;
  }
  return;
}

Assistant:

static void m68k_op_chk2cmp2_8_pcix(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint compare = REG_DA[(word2 >> 12) & 15]&0xff;
		uint ea = EA_PCIX_8();
		sint lower_bound = m68ki_read_pcrel_8(ea);
		sint upper_bound = m68ki_read_pcrel_8(ea + 1);

		if(!BIT_F(word2))
			compare = (int32)(int8)compare;
		FLAG_Z = !((upper_bound==compare) || (lower_bound==compare));  // JFF: | => ||, faster operation short circuits

    FLAG_C = (lower_bound <= upper_bound ? compare < lower_bound || compare > upper_bound : compare > upper_bound || compare < lower_bound) << 8;

		if(COND_CS() && BIT_B(word2))
				m68ki_exception_trap(EXCEPTION_CHK);
		return;

	}
	m68ki_exception_illegal();
}